

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void db_drop_test(void)

{
  size_t *psVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  fdb_status fVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_config *pfVar9;
  time_t tVar10;
  uint8_t *puVar11;
  btree *pbVar12;
  ulong uVar13;
  long lVar14;
  fdb_kvs_handle **ppfVar15;
  fdb_config *fconfig_00;
  uint uVar16;
  fdb_doc **unaff_RBP;
  char *info;
  char *pcVar17;
  fdb_kvs_handle *pfVar18;
  fdb_kvs_ops_info *unaff_R12;
  code *unaff_R13;
  fdb_doc *pfVar19;
  char *info_00;
  fdb_doc **ppfVar20;
  btree *pbVar21;
  bool bVar22;
  timeval tVar23;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  int iStack_16ec;
  fdb_doc *pfStack_16e8;
  fdb_file_handle *pfStack_16e0;
  undefined4 uStack_16d8;
  undefined3 uStack_16d4;
  undefined1 uStack_16d1;
  fdb_kvs_handle *pfStack_16d0;
  uint uStack_16c4;
  timeval tStack_16c0;
  timeval tStack_16b0;
  timeval tStack_16a0;
  fdb_file_info fStack_1690;
  char acStack_1648 [1032];
  fdb_config *pfStack_1240;
  fdb_kvs_ops_info *pfStack_1238;
  fdb_doc *pfStack_1230;
  btree *pbStack_1228;
  btree *pbStack_1220;
  fdb_config *pfStack_1218;
  fdb_kvs_handle *pfStack_1200;
  fdb_doc *pfStack_11f8;
  fdb_iterator *pfStack_11f0;
  undefined8 uStack_11e8;
  fdb_kvs_handle *apfStack_11e0 [4];
  undefined1 auStack_11c0 [64];
  undefined1 auStack_1180 [32];
  undefined1 auStack_1160 [56];
  undefined1 auStack_1128 [40];
  btree bStack_1100;
  char acStack_10b0 [256];
  undefined1 auStack_fb0 [16];
  undefined1 auStack_fa0 [16];
  undefined1 auStack_f90 [16];
  undefined1 auStack_f80 [16];
  undefined1 auStack_f70 [16];
  fdb_doc afStack_f60 [3];
  fdb_config fStack_e60;
  char *pcStack_d68;
  fdb_kvs_ops_info *pfStack_d60;
  fdb_doc *pfStack_d58;
  fdb_config *pfStack_d50;
  undefined1 *puStack_d48;
  fdb_doc **ppfStack_d40;
  undefined1 auStack_d38 [24];
  fdb_config fStack_d20;
  char acStack_c28 [256];
  char acStack_b28 [256];
  fdb_kvs_handle **ppfStack_a28;
  fdb_kvs_config *pfStack_a20;
  fdb_doc **ppfStack_a18;
  fdb_doc *pfStack_a00;
  fdb_kvs_handle *pfStack_9f8;
  fdb_kvs_handle *pfStack_9f0;
  fdb_file_handle *pfStack_9e8;
  fdb_kvs_handle *pfStack_9e0;
  fdb_kvs_config fStack_9d8;
  timeval tStack_9c0;
  fdb_doc *apfStack_9b0 [31];
  fdb_config fStack_8b8;
  char acStack_7c0 [256];
  fdb_doc *apfStack_6c0 [32];
  char acStack_5c0 [264];
  fdb_kvs_handle **ppfStack_4b8;
  fdb_kvs_ops_info *pfStack_4b0;
  fdb_doc *pfStack_4a8;
  fdb_kvs_config *pfStack_4a0;
  fdb_doc **ppfStack_498;
  fdb_doc **ppfStack_490;
  fdb_kvs_handle *local_480;
  fdb_kvs_handle *local_478;
  undefined1 local_470 [32];
  fdb_kvs_config local_450;
  timeval local_438;
  fdb_kvs_ops_info local_428 [4];
  fdb_doc *local_328 [32];
  char local_228 [256];
  fdb_config local_128;
  
  ppfStack_490 = (fdb_doc **)0x112242;
  gettimeofday(&local_438,(__timezone_ptr_t)0x0);
  ppfStack_490 = (fdb_doc **)0x112247;
  memleak_start();
  local_480 = (fdb_kvs_handle *)0x0;
  ppfStack_490 = (fdb_doc **)0x11225c;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_490 = (fdb_doc **)0x11226c;
  fdb_get_default_config();
  pfVar9 = &local_450;
  ppfStack_490 = (fdb_doc **)0x112279;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0x1000000;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  ppfVar20 = (fdb_doc **)local_470;
  ppfStack_490 = (fdb_doc **)0x1122ab;
  fdb_open((fdb_file_handle **)ppfVar20,"./dummy1",&local_128);
  ppfStack_490 = (fdb_doc **)0x1122c0;
  fdb_kvs_open((fdb_file_handle *)local_470._0_8_,&local_478,(char *)0x0,pfVar9);
  ppfStack_490 = (fdb_doc **)0x1122d6;
  fVar5 = fdb_set_log_callback(local_478,logCallbackFunc,"db_drop_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_kvs_ops_info *)0x0;
    uVar13 = 0;
    do {
      ppfStack_490 = (fdb_doc **)0x1122fe;
      sprintf(local_228,"key%d",uVar13 & 0xffffffff);
      ppfStack_490 = (fdb_doc **)0x112316;
      sprintf((char *)local_328,"meta%d",uVar13 & 0xffffffff);
      ppfStack_490 = (fdb_doc **)0x11232b;
      sprintf((char *)local_428,"body%d",uVar13 & 0xffffffff);
      ppfVar20 = (fdb_doc **)(local_470 + (long)unaff_R12 + 8);
      ppfStack_490 = (fdb_doc **)0x11233b;
      unaff_R13 = (code *)strlen(local_228);
      unaff_RBP = local_328;
      ppfStack_490 = (fdb_doc **)0x11234e;
      sVar7 = strlen((char *)unaff_RBP);
      ppfStack_490 = (fdb_doc **)0x11235b;
      sVar8 = strlen((char *)local_428);
      ppfStack_490 = (fdb_doc **)0x11237d;
      fdb_doc_create(ppfVar20,local_228,(size_t)unaff_R13,unaff_RBP,sVar7,local_428,sVar8);
      ppfStack_490 = (fdb_doc **)0x11238c;
      fdb_set(local_478,*(fdb_doc **)(local_470 + uVar13 * 8 + 8));
      uVar13 = uVar13 + 1;
      unaff_R12 = (fdb_kvs_ops_info *)((long)unaff_R12 + 8);
    } while (uVar13 == 1);
    pfVar9 = (fdb_kvs_config *)local_470;
    ppfStack_490 = (fdb_doc **)0x1123ac;
    fdb_commit((fdb_file_handle *)local_470._0_8_,'\0');
    ppfStack_490 = (fdb_doc **)0x1123b9;
    fdb_kvs_close(local_478);
    ppfStack_490 = (fdb_doc **)0x1123c1;
    fdb_close((fdb_file_handle *)local_470._0_8_);
    ppfStack_490 = (fdb_doc **)0x1123cd;
    system("rm -rf  dummy1 > errorlog.txt");
    ppfStack_490 = (fdb_doc **)0x1123e4;
    fdb_open((fdb_file_handle **)pfVar9,"./dummy1",&local_128);
    ppfStack_490 = (fdb_doc **)0x1123f4;
    fdb_kvs_open_default((fdb_file_handle *)local_470._0_8_,&local_478,&local_450);
    ppfStack_490 = (fdb_doc **)0x11240a;
    fVar5 = fdb_set_log_callback(local_478,logCallbackFunc,"db_drop_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011259f;
    ppfStack_490 = (fdb_doc **)0x11242d;
    sprintf(local_228,"key%d",0);
    ppfVar20 = local_328;
    ppfStack_490 = (fdb_doc **)0x112448;
    sprintf((char *)ppfVar20,"meta%d",0);
    unaff_R12 = local_428;
    ppfStack_490 = (fdb_doc **)0x112460;
    sprintf((char *)unaff_R12,"body%d",0);
    pfVar9 = (fdb_kvs_config *)(local_470 + 8);
    ppfStack_490 = (fdb_doc **)0x11246d;
    fdb_doc_free((fdb_doc *)local_470._8_8_);
    ppfStack_490 = (fdb_doc **)0x112475;
    unaff_R13 = (code *)strlen(local_228);
    ppfStack_490 = (fdb_doc **)0x112480;
    unaff_RBP = (fdb_doc **)strlen((char *)ppfVar20);
    ppfStack_490 = (fdb_doc **)0x11248b;
    sVar7 = strlen((char *)unaff_R12);
    ppfStack_490 = (fdb_doc **)0x1124a6;
    fdb_doc_create((fdb_doc **)pfVar9,local_228,(size_t)unaff_R13,ppfVar20,(size_t)unaff_RBP,
                   unaff_R12,sVar7);
    ppfStack_490 = (fdb_doc **)0x1124b3;
    fdb_set(local_478,(fdb_doc *)local_470._8_8_);
    ppfStack_490 = (fdb_doc **)0x1124bf;
    fdb_commit((fdb_file_handle *)local_470._0_8_,'\0');
    ppfVar15 = &local_480;
    ppfStack_490 = (fdb_doc **)0x1124e6;
    fdb_doc_create((fdb_doc **)ppfVar15,*(void **)(local_470._8_8_ + 0x20),
                   *(size_t *)local_470._8_8_,(void *)0x0,0,(void *)0x0,0);
    ppfStack_490 = (fdb_doc **)0x1124f3;
    fVar5 = fdb_get(local_478,(fdb_doc *)local_480);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      if (local_480->fhandle != (fdb_file_handle *)0x1) {
        ppfStack_490 = (fdb_doc **)0x112511;
        db_drop_test();
      }
      ppfStack_490 = (fdb_doc **)0x11251b;
      fdb_kvs_close(local_478);
      ppfStack_490 = (fdb_doc **)0x112525;
      fdb_close((fdb_file_handle *)local_470._0_8_);
      ppfStack_490 = (fdb_doc **)0x11252f;
      fdb_doc_free((fdb_doc *)local_480);
      local_480 = (fdb_kvs_handle *)0x0;
      lVar14 = 0;
      do {
        ppfStack_490 = (fdb_doc **)0x112544;
        fdb_doc_free(*(fdb_doc **)(local_470 + lVar14 * 8 + 8));
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      ppfStack_490 = (fdb_doc **)0x112552;
      fdb_shutdown();
      ppfStack_490 = (fdb_doc **)0x112557;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (db_drop_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      ppfStack_490 = (fdb_doc **)0x112588;
      fprintf(_stderr,pcVar17,"Database drop test");
      return;
    }
  }
  else {
    ppfStack_490 = (fdb_doc **)0x11259f;
    db_drop_test();
LAB_0011259f:
    ppfVar15 = &local_478;
    ppfStack_490 = (fdb_doc **)0x1125a4;
    db_drop_test();
  }
  ppfStack_490 = (fdb_doc **)db_destroy_test;
  db_drop_test();
  ppfStack_a18 = (fdb_doc **)0x1125c6;
  ppfStack_4b8 = ppfVar15;
  pfStack_4b0 = unaff_R12;
  pfStack_4a8 = (fdb_doc *)unaff_R13;
  pfStack_4a0 = pfVar9;
  ppfStack_498 = ppfVar20;
  ppfStack_490 = unaff_RBP;
  gettimeofday(&tStack_9c0,(__timezone_ptr_t)0x0);
  ppfStack_a18 = (fdb_doc **)0x1125cb;
  memleak_start();
  pfStack_9f8 = (fdb_kvs_handle *)0x0;
  ppfStack_a18 = (fdb_doc **)0x1125e0;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_a18 = (fdb_doc **)0x1125f0;
  fdb_get_default_config();
  pfVar9 = &fStack_9d8;
  ppfStack_a18 = (fdb_doc **)0x1125fd;
  fdb_get_default_kvs_config();
  fStack_8b8.buffercache_size = 0x1000000;
  fStack_8b8.wal_threshold = 0x400;
  fStack_8b8.flags = 1;
  fStack_8b8.compaction_threshold = '\0';
  ppfVar20 = &pfStack_a00;
  ppfStack_a18 = (fdb_doc **)0x11262f;
  fdb_open((fdb_file_handle **)ppfVar20,"./dummy1",&fStack_8b8);
  ppfVar15 = &pfStack_9f0;
  ppfStack_a18 = (fdb_doc **)0x112644;
  fdb_kvs_open((fdb_file_handle *)pfStack_a00,ppfVar15,(char *)0x0,pfVar9);
  ppfStack_a18 = (fdb_doc **)0x11265a;
  fVar5 = fdb_set_log_callback(pfStack_9f0,logCallbackFunc,"db_destroy_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_kvs_ops_info *)0x0;
    uVar13 = 0;
    do {
      ppfStack_a18 = (fdb_doc **)0x112682;
      sprintf(acStack_5c0,"key%d",uVar13 & 0xffffffff);
      ppfStack_a18 = (fdb_doc **)0x11269a;
      sprintf((char *)apfStack_6c0,"meta%d",uVar13 & 0xffffffff);
      ppfStack_a18 = (fdb_doc **)0x1126b2;
      sprintf(acStack_7c0,"body%d",uVar13 & 0xffffffff);
      ppfVar20 = (fdb_doc **)((long)apfStack_9b0 + (long)unaff_R12);
      ppfStack_a18 = (fdb_doc **)0x1126c2;
      unaff_R13 = (code *)strlen(acStack_5c0);
      unaff_RBP = apfStack_6c0;
      ppfStack_a18 = (fdb_doc **)0x1126d5;
      pfVar9 = (fdb_kvs_config *)strlen((char *)unaff_RBP);
      ppfStack_a18 = (fdb_doc **)0x1126e5;
      sVar7 = strlen(acStack_7c0);
      ppfStack_a18 = (fdb_doc **)0x11270a;
      fdb_doc_create(ppfVar20,acStack_5c0,(size_t)unaff_R13,unaff_RBP,(size_t)pfVar9,acStack_7c0,
                     sVar7);
      ppfStack_a18 = (fdb_doc **)0x112719;
      fdb_set(pfStack_9f0,apfStack_9b0[uVar13]);
      uVar13 = uVar13 + 1;
      unaff_R12 = (fdb_kvs_ops_info *)((long)unaff_R12 + 8);
    } while (uVar13 != 0x1e);
    ppfStack_a18 = (fdb_doc **)0x112736;
    fdb_commit((fdb_file_handle *)pfStack_a00,'\0');
    ppfStack_a18 = (fdb_doc **)0x112752;
    fdb_open(&pfStack_9e8,"./dummy2",&fStack_8b8);
    ppfVar15 = &pfStack_9e0;
    ppfStack_a18 = (fdb_doc **)0x112769;
    fdb_kvs_open(pfStack_9e8,ppfVar15,(char *)0x0,&fStack_9d8);
    ppfStack_a18 = (fdb_doc **)0x11277f;
    fVar5 = fdb_set_log_callback(pfStack_9e0,logCallbackFunc,"db_destroy_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011290e;
    lVar14 = 0;
    do {
      ppfStack_a18 = (fdb_doc **)0x112798;
      fdb_set(pfStack_9e0,apfStack_9b0[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x1e);
    ppfStack_a18 = (fdb_doc **)0x1127ad;
    fdb_commit(pfStack_9e8,'\0');
    ppfStack_a18 = (fdb_doc **)0x1127b7;
    fdb_close((fdb_file_handle *)pfStack_a00);
    ppfStack_a18 = (fdb_doc **)0x1127cb;
    fVar5 = fdb_destroy("./dummy2",&fStack_8b8);
    ppfVar15 = (fdb_kvs_handle **)0x1e;
    if (fVar5 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00112913;
    ppfStack_a18 = (fdb_doc **)0x1127de;
    fdb_close(pfStack_9e8);
    ppfStack_a18 = (fdb_doc **)0x1127f2;
    fVar5 = fdb_destroy("./dummy1",&fStack_8b8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112918;
    ppfStack_a18 = (fdb_doc **)0x112816;
    fdb_open((fdb_file_handle **)&pfStack_a00,"./dummy1",&fStack_8b8);
    ppfVar15 = &pfStack_9f0;
    ppfStack_a18 = (fdb_doc **)0x11282d;
    fdb_kvs_open((fdb_file_handle *)pfStack_a00,ppfVar15,(char *)0x0,&fStack_9d8);
    ppfStack_a18 = (fdb_doc **)0x112843;
    fVar5 = fdb_set_log_callback(pfStack_9f0,logCallbackFunc,"db_destroy_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011291d;
    ppfVar15 = &pfStack_9f8;
    ppfStack_a18 = (fdb_doc **)0x112874;
    fdb_doc_create((fdb_doc **)ppfVar15,apfStack_9b0[0]->key,apfStack_9b0[0]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_a18 = (fdb_doc **)0x112881;
    fVar5 = fdb_get(pfStack_9f0,(fdb_doc *)pfStack_9f8);
    if (fVar5 == FDB_RESULT_KEY_NOT_FOUND) {
      ppfStack_a18 = (fdb_doc **)0x112894;
      fdb_close((fdb_file_handle *)pfStack_a00);
      ppfStack_a18 = (fdb_doc **)0x11289e;
      fdb_doc_free((fdb_doc *)pfStack_9f8);
      pfStack_9f8 = (fdb_kvs_handle *)0x0;
      lVar14 = 0;
      do {
        ppfStack_a18 = (fdb_doc **)0x1128b3;
        fdb_doc_free(apfStack_9b0[lVar14]);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x1e);
      ppfStack_a18 = (fdb_doc **)0x1128c1;
      fdb_shutdown();
      ppfStack_a18 = (fdb_doc **)0x1128c6;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (db_destroy_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      ppfStack_a18 = (fdb_doc **)0x1128f7;
      fprintf(_stderr,pcVar17,"Database destroy test");
      return;
    }
  }
  else {
    ppfStack_a18 = (fdb_doc **)0x11290e;
    db_destroy_test();
LAB_0011290e:
    ppfStack_a18 = (fdb_doc **)0x112913;
    db_destroy_test();
LAB_00112913:
    ppfStack_a18 = (fdb_doc **)0x112918;
    db_destroy_test();
LAB_00112918:
    ppfStack_a18 = (fdb_doc **)0x11291d;
    db_destroy_test();
LAB_0011291d:
    ppfStack_a18 = (fdb_doc **)0x112922;
    db_destroy_test();
  }
  ppfStack_a18 = (fdb_doc **)db_destroy_test_full_path;
  db_destroy_test();
  pbVar21 = (btree *)auStack_d38;
  pbVar12 = (btree *)auStack_d38;
  ppfStack_d40 = (fdb_doc **)0x11293f;
  ppfStack_a28 = ppfVar15;
  pfStack_a20 = pfVar9;
  ppfStack_a18 = ppfVar20;
  gettimeofday((timeval *)(auStack_d38 + 8),(__timezone_ptr_t)0x0);
  ppfStack_d40 = (fdb_doc **)0x112944;
  memleak_start();
  ppfStack_d40 = (fdb_doc **)0x11294b;
  tVar10 = time((time_t *)0x0);
  ppfStack_d40 = (fdb_doc **)0x112952;
  srand((uint)tVar10);
  ppfStack_d40 = (fdb_doc **)0x112957;
  iVar6 = rand();
  ppfStack_d40 = (fdb_doc **)0x11298f;
  sprintf(acStack_b28,"/tmp/fdb_destroy_test_%d",(ulong)(uint)(iVar6 % 10000));
  ppfStack_d40 = (fdb_doc **)0x1129ab;
  sprintf(acStack_c28,"rm -rf %s*",acStack_b28);
  ppfStack_d40 = (fdb_doc **)0x1129b3;
  system(acStack_c28);
  ppfStack_d40 = (fdb_doc **)0x1129c0;
  fdb_get_default_config();
  fStack_d20.compaction_mode = '\x01';
  ppfStack_d40 = (fdb_doc **)0x1129d6;
  fdb_open((fdb_file_handle **)auStack_d38,acStack_b28,&fStack_d20);
  ppfStack_d40 = (fdb_doc **)0x1129de;
  fdb_close((fdb_file_handle *)auStack_d38._0_8_);
  ppfStack_d40 = (fdb_doc **)0x1129e9;
  pcVar17 = acStack_b28;
  fVar5 = fdb_destroy(acStack_b28,&fStack_d20);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    ppfStack_d40 = (fdb_doc **)0x1129f2;
    fdb_shutdown();
    ppfStack_d40 = (fdb_doc **)0x1129f7;
    memleak_end();
    pcVar17 = "%s PASSED\n";
    if (db_destroy_test_full_path()::__test_pass != '\0') {
      pcVar17 = "%s FAILED\n";
    }
    ppfStack_d40 = (fdb_doc **)0x112a28;
    fprintf(_stderr,pcVar17,"Database destroy (full path) test");
    return;
  }
  ppfStack_d40 = (fdb_doc **)operational_stats_test;
  db_destroy_test_full_path();
  info = (char *)((ulong)pcVar17 & 0xffffffff);
  info_00 = (char *)0x0;
  pfStack_1218 = (fdb_config *)0x112a5f;
  pcStack_d68 = acStack_b28;
  pfStack_d60 = unaff_R12;
  pfStack_d58 = (fdb_doc *)unaff_R13;
  pfStack_d50 = &fStack_d20;
  puStack_d48 = auStack_d38;
  ppfStack_d40 = unaff_RBP;
  gettimeofday((timeval *)(auStack_1128 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1218 = (fdb_config *)0x112a64;
  memleak_start();
  pfStack_11f8 = (fdb_doc *)auStack_fb0;
  auStack_11c0._0_16_ = (undefined1  [16])0x0;
  auStack_11c0._16_8_ = (void *)0x0;
  auStack_11c0._24_8_ = (kvs_info *)0x0;
  auStack_11c0._32_8_ = (fdb_config *)0x0;
  auStack_11c0._40_8_ = (fdb_file_handle *)0x0;
  auStack_11c0._48_8_ = (hbtrie *)0x0;
  auStack_fb0 = (undefined1  [16])0x0;
  auStack_fa0 = (undefined1  [16])0x0;
  auStack_f80 = (undefined1  [16])0x0;
  auStack_f90._8_8_ = 0;
  auStack_f90._0_8_ = acStack_10b0;
  auStack_f70._8_8_ = 0;
  auStack_f70._0_8_ = afStack_f60;
  pfStack_1218 = (fdb_config *)0x112acb;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig_00 = &fStack_e60;
  pfStack_1218 = (fdb_config *)0x112adb;
  fdb_get_default_config();
  pfStack_1218 = (fdb_config *)0x112ae8;
  fdb_get_default_kvs_config();
  fStack_e60.buffercache_size = 0;
  fStack_e60.seqtree_opt = '\x01';
  fStack_e60.wal_threshold = 0x400;
  fStack_e60.flags = 1;
  fStack_e60.compaction_threshold = '\0';
  fStack_e60.multi_kv_instances = SUB81(info,0);
  pfStack_1218 = (fdb_config *)0x112b1b;
  fdb_open((fdb_file_handle **)&pfStack_1200,"./dummy1",fconfig_00);
  uStack_11e8._4_4_ = (int)pcVar17;
  if (uStack_11e8._4_4_ != 0) {
    fconfig_00 = (fdb_config *)0x3;
    info_00 = (char *)0x18;
    pbVar21 = (btree *)auStack_1160;
    unaff_R12 = (fdb_kvs_ops_info *)auStack_1128;
    unaff_R13 = logCallbackFunc;
    info = "operational_stats_test";
    do {
      pfStack_1218 = (fdb_config *)0x112b63;
      sprintf((char *)pbVar21,"kv%d",(ulong)fconfig_00 & 0xffffffff);
      pfStack_1218 = (fdb_config *)0x112b7b;
      fVar5 = fdb_kvs_open((fdb_file_handle *)pfStack_1200,
                           (fdb_kvs_handle **)((long)apfStack_11e0 + (long)info_00),(char *)pbVar21,
                           (fdb_kvs_config *)unaff_R12);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113110;
      pfStack_1218 = (fdb_config *)0x112b93;
      fVar5 = fdb_set_log_callback
                        (apfStack_11e0[(long)fconfig_00],logCallbackFunc,"operational_stats_test");
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011310b;
      info_00 = (char *)&((btree *)((long)info_00 + -0x38))->aux;
      bVar22 = fconfig_00 != (fdb_config *)0x0;
      fconfig_00 = (fdb_config *)&fconfig_00[-1].field_0xf7;
    } while (bVar22);
    auStack_11c0._56_8_ = (btree *)0x3;
LAB_00112bed:
    puVar11 = &((btree *)auStack_11c0._56_8_)->vsize;
    info = auStack_1160;
    fconfig_00 = (fdb_config *)auStack_11c0;
    info_00 = (char *)0x0;
    do {
      pfStack_1218 = (fdb_config *)0x112c29;
      sprintf(acStack_10b0,"key%d",(ulong)info_00 & 0xffffffff);
      unaff_R13 = (code *)afStack_f60;
      pfStack_1218 = (fdb_config *)0x112c45;
      sprintf((char *)unaff_R13,"body%d",(ulong)info_00 & 0xffffffff);
      unaff_R12 = (fdb_kvs_ops_info *)(&bStack_1100.ksize + (long)info_00 * 8);
      pfStack_1218 = (fdb_config *)0x112c58;
      sVar7 = strlen(acStack_10b0);
      pfStack_1218 = (fdb_config *)0x112c64;
      sVar8 = strlen((char *)unaff_R13);
      pfStack_1218 = (fdb_config *)0x112c86;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_10b0,sVar7 + 1,(void *)0x0,0,unaff_R13,sVar8 + 1)
      ;
      info_00 = (char *)((long)info_00 + 1);
      pbVar21 = (btree *)puVar11;
      do {
        pfStack_1218 = (fdb_config *)0x112c9c;
        fVar5 = fdb_set((fdb_kvs_handle *)(&uStack_11e8)[(long)pbVar21],
                        (fdb_doc *)unaff_R12->num_sets);
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_1218 = (fdb_config *)0x11308a;
          operational_stats_test();
LAB_0011308a:
          pfStack_1218 = (fdb_config *)0x11308f;
          operational_stats_test();
LAB_0011308f:
          pfStack_1218 = (fdb_config *)0x1130a1;
          operational_stats_test();
          pfVar19 = (fdb_doc *)unaff_R13;
          goto LAB_001130a1;
        }
        pfStack_1218 = (fdb_config *)0x112cb1;
        fVar5 = fdb_get_kvs_ops_info
                          ((fdb_kvs_handle *)(&uStack_11e8)[(long)pbVar21],(fdb_kvs_ops_info *)info)
        ;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011308a;
        auStack_11c0._0_8_ = info_00;
        pfStack_1218 = (fdb_config *)0x112cce;
        iVar6 = bcmp(info,fconfig_00,0x38);
        if (iVar6 != 0) goto LAB_0011308f;
        pbVar12 = (btree *)((long)&pbVar21[-1].aux + 7);
        bVar22 = 0 < (long)pbVar21;
        pbVar21 = pbVar12;
      } while (pbVar12 != (btree *)0x0 && bVar22);
    } while (info_00 != (char *)0xa);
    info_00 = auStack_1160;
    pbVar12 = (btree *)auStack_11c0._56_8_;
    do {
      pfStack_1218 = (fdb_config *)0x112d1a;
      fdb_iterator_init(apfStack_11e0[(long)pbVar12],&pfStack_11f0,(void *)0x0,0,(void *)0x0,0,0);
      pbVar21 = &bStack_1100;
      pfVar19 = (fdb_doc *)unaff_R13;
      do {
        pfStack_1218 = (fdb_config *)0x112d31;
        fVar5 = fdb_iterator_get(pfStack_11f0,&pfStack_11f8);
        unaff_R13 = (code *)pfStack_11f8;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130a1;
        fconfig_00 = (fdb_config *)pfStack_11f8->key;
        unaff_R12 = *(fdb_kvs_ops_info **)pbVar21;
        info = (char *)unaff_R12->num_gets;
        pfStack_1218 = (fdb_config *)0x112d59;
        iVar6 = bcmp(fconfig_00,info,pfStack_11f8->keylen);
        if (iVar6 != 0) goto LAB_001130ab;
        fconfig_00 = (fdb_config *)((fdb_doc *)unaff_R13)->body;
        info = (char *)unaff_R12[1].num_dels;
        pfStack_1218 = (fdb_config *)0x112d79;
        iVar6 = bcmp(fconfig_00,info,((fdb_doc *)unaff_R13)->bodylen);
        if (iVar6 != 0) goto LAB_001130c8;
        pfStack_1218 = (fdb_config *)0x112d93;
        fVar5 = fdb_get_kvs_ops_info(apfStack_11e0[(long)pbVar12],(fdb_kvs_ops_info *)info_00);
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130a6;
        auStack_11c0._40_8_ = (long)(fdb_kvs_handle **)auStack_11c0._40_8_ + 1;
        auStack_11c0._48_8_ = auStack_11c0._48_8_ + 1;
        pfStack_1218 = (fdb_config *)0x112dc1;
        iVar6 = bcmp(info_00,auStack_11c0,0x38);
        if (iVar6 != 0) goto LAB_001130b6;
        pfStack_1218 = (fdb_config *)0x112dd3;
        fVar5 = fdb_iterator_next(pfStack_11f0);
        pbVar21 = (btree *)&pbVar21->root_bid;
        pfVar19 = (fdb_doc *)unaff_R13;
      } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
      auStack_11c0._48_8_ = auStack_11c0._48_8_ + 1;
      pfStack_1218 = (fdb_config *)0x112df2;
      fdb_iterator_close(pfStack_11f0);
      pfStack_1218 = (fdb_config *)0x112e01;
      fdb_commit((fdb_file_handle *)pfStack_1200,'\x01');
      auStack_11c0._16_8_ = (void *)(auStack_11c0._16_8_ + 1);
      pfStack_1218 = (fdb_config *)0x112e18;
      fVar5 = fdb_get_kvs_ops_info(apfStack_11e0[(long)pbVar12],(fdb_kvs_ops_info *)info_00);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113101;
      pfStack_1218 = (fdb_config *)0x112e32;
      iVar6 = bcmp(info_00,auStack_11c0,0x38);
      if (iVar6 != 0) goto LAB_001130ef;
      if (pbVar12 != (btree *)0x0) {
        auStack_11c0._40_8_ = (fdb_file_handle *)0x0;
        auStack_11c0._48_8_ = (hbtrie *)0x0;
      }
      bVar22 = 0 < (long)pbVar12;
      pbVar12 = (btree *)((long)&pbVar12[-1].aux + 7);
    } while (bVar22);
    auStack_11c0._24_8_ = auStack_11c0._24_8_ + 1;
    pfStack_1218 = (fdb_config *)0x112e74;
    fdb_compact((fdb_file_handle *)pfStack_1200,"./dummy2");
    pfStack_1218 = (fdb_config *)0x112e86;
    fVar5 = fdb_get_kvs_ops_info(apfStack_11e0[0],(fdb_kvs_ops_info *)auStack_1160);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113115;
    pfStack_1218 = (fdb_config *)0x112ea5;
    iVar6 = bcmp(auStack_1160,auStack_11c0,0x38);
    info_00 = (char *)auStack_11c0._56_8_;
    if (iVar6 == 0) {
      pbVar21 = (btree *)(auStack_11c0._56_8_ + 1);
      unaff_R12 = (fdb_kvs_ops_info *)auStack_1160;
      unaff_R13 = (code *)auStack_11c0;
      fconfig_00 = (fdb_config *)0x0;
      do {
        pfStack_1218 = (fdb_config *)0x112ee2;
        sprintf(acStack_10b0,"key%d",(ulong)fconfig_00 & 0xffffffff);
        info = (char *)((long)&fconfig_00->chunksize + 1);
        info_00 = (char *)pbVar21;
        do {
          if (((ulong)fconfig_00 & 1) == 0) {
            if (((ulong)fconfig_00 & 2) == 0) {
              pfStack_1218 = (fdb_config *)0x112f01;
              fVar5 = fdb_get_metaonly((fdb_kvs_handle *)(&uStack_11e8)[(long)info_00],pfStack_11f8)
              ;
            }
            else {
              pfStack_11f8->seqnum = (fdb_seqnum_t)info;
              pfStack_1218 = (fdb_config *)0x112f27;
              fVar5 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_11e8)[(long)info_00],pfStack_11f8);
            }
          }
          else {
            pfStack_1218 = (fdb_config *)0x112f12;
            fVar5 = fdb_get((fdb_kvs_handle *)(&uStack_11e8)[(long)info_00],pfStack_11f8);
          }
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130d3;
          pfStack_1218 = (fdb_config *)0x112f3c;
          fVar5 = fdb_get_kvs_ops_info((fdb_kvs_handle *)(&uStack_11e8)[(long)info_00],unaff_R12);
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130d8;
          pfStack_1218 = (fdb_config *)0x112f59;
          auStack_11c0._32_8_ = info;
          iVar6 = bcmp(unaff_R12,unaff_R13,0x38);
          if (iVar6 != 0) goto LAB_001130dd;
          pbVar12 = (btree *)((long)&((btree *)((long)info_00 + -0x38))->aux + 7);
          bVar22 = 0 < (long)info_00;
          info_00 = (char *)pbVar12;
        } while (pbVar12 != (btree *)0x0 && bVar22);
        fconfig_00 = (fdb_config *)info;
      } while ((fdb_config *)info != (fdb_config *)0xa);
      fconfig_00 = (fdb_config *)auStack_1180;
      pbVar21 = (btree *)&stderr;
      info_00 = "%d:\t%u\t%u\t%u\t%lu\n";
      info = (char *)0x0;
      while( true ) {
        auStack_1180._0_16_ = (undefined1  [16])0x0;
        auStack_1180._16_8_ = (docio_handle *)0x0;
        pfStack_1218 = (fdb_config *)0x112fb5;
        fVar5 = fdb_get_latency_stats
                          ((fdb_file_handle *)pfStack_1200,(fdb_latency_stat *)fconfig_00,
                           (fdb_latency_stat_type)info);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pfStack_1218 = (fdb_config *)0x112fea;
        fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",info);
        uVar16 = (int)info + 1;
        info = (char *)(ulong)uVar16;
        if (uVar16 == 0x13) {
          pfStack_1218 = (fdb_config *)0x112ffb;
          fdb_close((fdb_file_handle *)pfStack_1200);
          lVar14 = 0;
          do {
            pfStack_1218 = (fdb_config *)0x11300a;
            fdb_doc_free(*(fdb_doc **)(&bStack_1100.ksize + lVar14 * 8));
            lVar14 = lVar14 + 1;
          } while (lVar14 != 10);
          pfStack_1218 = (fdb_config *)0x113018;
          fdb_shutdown();
          pfStack_1218 = (fdb_config *)0x11301d;
          memleak_end();
          pcVar17 = "single kv instance";
          if (uStack_11e8._4_1_ != '\0') {
            pcVar17 = "multiple kv instances";
          }
          pfStack_1218 = (fdb_config *)0x11304d;
          sprintf((char *)afStack_f60,"Operational stats test %s",pcVar17);
          pcVar17 = "%s PASSED\n";
          if (operational_stats_test(bool)::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          pfStack_1218 = (fdb_config *)0x113073;
          fprintf(_stderr,pcVar17,afStack_f60);
          return;
        }
      }
      goto LAB_00113106;
    }
    goto LAB_0011311a;
  }
  pfStack_1218 = (fdb_config *)0x112bc3;
  pfVar18 = pfStack_1200;
  fVar5 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_1200,apfStack_11e0,(fdb_kvs_config *)auStack_1128);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_1218 = (fdb_config *)0x112be3;
    pfVar18 = apfStack_11e0[0];
    fVar5 = fdb_set_log_callback(apfStack_11e0[0],logCallbackFunc,"operational_stats_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113131;
    auStack_11c0._56_8_ = (btree *)0x0;
    goto LAB_00112bed;
  }
  goto LAB_0011312c;
LAB_001130a1:
  unaff_R13 = (code *)pfVar19;
  pfStack_1218 = (fdb_config *)0x1130a6;
  operational_stats_test();
LAB_001130a6:
  pfStack_1218 = (fdb_config *)0x1130ab;
  operational_stats_test();
LAB_001130ab:
  pfStack_1218 = (fdb_config *)0x1130b6;
  operational_stats_test();
LAB_001130b6:
  pfStack_1218 = (fdb_config *)0x1130c8;
  operational_stats_test();
LAB_001130c8:
  pfStack_1218 = (fdb_config *)0x1130d3;
  operational_stats_test();
LAB_001130d3:
  pfStack_1218 = (fdb_config *)0x1130d8;
  operational_stats_test();
LAB_001130d8:
  pfStack_1218 = (fdb_config *)0x1130dd;
  operational_stats_test();
LAB_001130dd:
  pfStack_1218 = (fdb_config *)0x1130ef;
  operational_stats_test();
LAB_001130ef:
  pfStack_1218 = (fdb_config *)0x113101;
  operational_stats_test();
LAB_00113101:
  pfStack_1218 = (fdb_config *)0x113106;
  operational_stats_test();
LAB_00113106:
  pfStack_1218 = (fdb_config *)0x11310b;
  operational_stats_test();
LAB_0011310b:
  pfStack_1218 = (fdb_config *)0x113110;
  operational_stats_test();
LAB_00113110:
  pfStack_1218 = (fdb_config *)0x113115;
  operational_stats_test();
LAB_00113115:
  pfStack_1218 = (fdb_config *)0x11311a;
  operational_stats_test();
LAB_0011311a:
  pfVar18 = (fdb_kvs_handle *)auStack_11c0;
  pfStack_1218 = (fdb_config *)0x11312c;
  operational_stats_test();
LAB_0011312c:
  pfStack_1218 = (fdb_config *)0x113131;
  operational_stats_test();
  pbVar12 = pbVar21;
LAB_00113131:
  pfStack_1218 = (fdb_config *)_worker_thread;
  operational_stats_test();
  pfStack_1240 = fconfig_00;
  pfStack_1238 = unaff_R12;
  pfStack_1230 = (fdb_doc *)unaff_R13;
  pbStack_1228 = (btree *)info_00;
  pbStack_1220 = pbVar12;
  pfStack_1218 = (fdb_config *)info;
  gettimeofday(&tStack_16a0,(__timezone_ptr_t)0x0);
  pfStack_16e8 = (fdb_doc *)0x0;
  sprintf(acStack_1648,"dummy%d",(ulong)*(uint *)&pfVar18->file->filename);
  fdb_open(&pfStack_16e0,acStack_1648,(fdb_config *)pfVar18->btreeblkops);
  fdb_kvs_open_default(pfStack_16e0,&pfStack_16d0,(fdb_kvs_config *)pfVar18->fileops);
  fVar5 = fdb_set_log_callback(pfStack_16d0,logCallbackFunc,"worker_thread");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x6c4);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x6c4,"void *_worker_thread(void *)");
  }
  pthread_spin_lock((pthread_spinlock_t *)pfVar18->dhandle);
  *(int *)(pfVar18->field_6).seqtree = *(int *)(pfVar18->field_6).seqtree + 1;
  pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
  while( true ) {
    pthread_spin_lock((pthread_spinlock_t *)pfVar18->dhandle);
    pbVar21 = (pfVar18->field_6).seqtree;
    iVar6._0_1_ = pbVar21->ksize;
    iVar6._1_1_ = pbVar21->vsize;
    iVar6._2_2_ = pbVar21->height;
    if ((list *)(pfVar18->kvs_config).custom_cmp == (list *)(long)iVar6) break;
    pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
    sleep(1);
  }
  pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
  gettimeofday((timeval *)&tStack_16b0,(__timezone_ptr_t)0x0);
  uStack_16d1 = 0;
  uVar13 = 0;
  iStack_16ec = 0;
  do {
    iVar6 = rand();
    iVar6 = (int)((ulong)(long)iVar6 % (ulong)(pfVar18->kvs_config).custom_cmp_param);
    psVar1 = (size_t *)(&pfVar18->op_stats->num_sets)[iVar6].super___atomic_base<unsigned_long>._M_i
    ;
    fdb_doc_create(&pfStack_16e8,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
    fVar5 = fdb_get(pfStack_16d0,pfStack_16e8);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e1);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e1,"void *_worker_thread(void *)");
    }
    plVar2 = (long *)pfStack_16e8->body;
    plVar3 = *(long **)((&pfVar18->op_stats->num_sets)[iVar6].super___atomic_base<unsigned_long>.
                        _M_i + 0x40);
    if (*plVar2 != *plVar3) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",plVar3,plVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e2);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e2,"void *_worker_thread(void *)");
    }
    if (pfVar18->kvs != (kvs_info *)0x0) {
      uStack_16d8 = (undefined4)plVar2[1];
      uStack_16d4 = (undefined3)((uint)*(undefined4 *)((long)plVar2 + 0xb) >> 8);
      iVar6 = atoi((char *)&uStack_16d8);
      sprintf((char *)&uStack_16d8,"%0 7d",(ulong)(iVar6 + 1));
      pvVar4 = pfStack_16e8->body;
      *(uint *)((long)pvVar4 + 0xb) = CONCAT31(uStack_16d4,uStack_16d8._3_1_);
      *(undefined4 *)((long)pvVar4 + 8) = uStack_16d8;
      fVar5 = fdb_set(pfStack_16d0,pfStack_16e8);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x6f0);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x6f0,"void *_worker_thread(void *)");
      }
      if ((pfVar18->trie != (hbtrie *)0x0) && (uVar13 % (ulong)pfVar18->trie == 0)) {
        fdb_commit(pfStack_16e0,'\0');
        iStack_16ec = iStack_16ec + 1;
        fdb_get_file_info(pfStack_16e0,&fStack_1690);
        if ((pfVar18->staletree == (btree *)(long)iStack_16ec) &&
           (((pfVar18->staletree != (btree *)0x0 && (fStack_1690.new_filename == (char *)0x0)) &&
            (*(int *)&pfVar18->kvs_config == 0)))) {
          pthread_spin_lock((pthread_spinlock_t *)pfVar18->dhandle);
          uStack_16c4 = *(int *)&pfVar18->file->filename + 1;
          *(uint *)&pfVar18->file->filename = uStack_16c4;
          pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
          iStack_16ec = 0;
          sprintf(acStack_1648,"dummy%d",(ulong)uStack_16c4);
          fVar5 = fdb_compact(pfStack_16e0,acStack_1648);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pthread_spin_lock((pthread_spinlock_t *)pfVar18->dhandle);
            *(int *)&pfVar18->file->filename = *(int *)&pfVar18->file->filename + -1;
            pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
          }
        }
      }
    }
    fdb_doc_free(pfStack_16e8);
    pfStack_16e8 = (fdb_doc *)0x0;
    uVar13 = uVar13 + 1;
    gettimeofday((timeval *)&tStack_16c0,(__timezone_ptr_t)0x0);
    tVar23 = _utime_gap(tStack_16b0,tStack_16c0);
  } while ((fdb_file_handle *)tVar23.tv_sec < pfVar18->fhandle);
  pcVar17 = "writer";
  if (pfVar18->kvs == (kvs_info *)0x0) {
    pcVar17 = "reader";
  }
  printf("Thread #%d (%s) %d ops / %d seconds\n",(ulong)*(uint *)&pfVar18->kvs_config,pcVar17,
         uVar13 & 0xffffffff);
  pfVar18->bhandle = (btreeblk_handle *)(uVar13 & 0xffffffff);
  fdb_commit(pfStack_16e0,'\x01');
  fdb_kvs_close(pfStack_16d0);
  fdb_close(pfStack_16e0);
  pthread_exit((void *)0x0);
}

Assistant:

void db_drop_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_drop_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert first two documents
    for (i=0;i<2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // Remove the database file manually.
    r = system(SHELL_DEL " dummy1 > errorlog.txt");
    (void)r;

    // Open the empty db with the same name.
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_drop_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // now insert a new doc.
    sprintf(keybuf, "key%d", 0);
    sprintf(metabuf, "meta%d", 0);
    sprintf(bodybuf, "body%d", 0);
    fdb_doc_free(doc[0]);
    fdb_doc_create(&doc[0], (void*)keybuf, strlen(keybuf),
        (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[0]);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // search by key
    fdb_doc_create(&rdoc, doc[0]->key, doc[0]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // Make sure that a doc seqnum starts with one.
    TEST_CHK(rdoc->seqnum == 1);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    fdb_doc_free(rdoc);
    rdoc = NULL;
    for (i=0;i<2;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Database drop test");
}